

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O0

void png_destroy_gamma_table(png_structrp png_ptr)

{
  int iVar1;
  int local_24;
  int istop_2;
  int i_2;
  int istop_1;
  int i_1;
  int istop;
  int i;
  png_structrp png_ptr_local;
  
  png_free(png_ptr,png_ptr->gamma_table);
  png_ptr->gamma_table = (png_bytep)0x0;
  if (png_ptr->gamma_16_table != (png_uint_16pp)0x0) {
    iVar1 = png_ptr->gamma_shift;
    for (i_1 = 0; i_1 < 1 << (8U - (char)iVar1 & 0x1f); i_1 = i_1 + 1) {
      png_free(png_ptr,png_ptr->gamma_16_table[i_1]);
    }
    png_free(png_ptr,png_ptr->gamma_16_table);
    png_ptr->gamma_16_table = (png_uint_16pp)0x0;
  }
  png_free(png_ptr,png_ptr->gamma_from_1);
  png_ptr->gamma_from_1 = (png_bytep)0x0;
  png_free(png_ptr,png_ptr->gamma_to_1);
  png_ptr->gamma_to_1 = (png_bytep)0x0;
  if (png_ptr->gamma_16_from_1 != (png_uint_16pp)0x0) {
    iVar1 = png_ptr->gamma_shift;
    for (i_2 = 0; i_2 < 1 << (8U - (char)iVar1 & 0x1f); i_2 = i_2 + 1) {
      png_free(png_ptr,png_ptr->gamma_16_from_1[i_2]);
    }
    png_free(png_ptr,png_ptr->gamma_16_from_1);
    png_ptr->gamma_16_from_1 = (png_uint_16pp)0x0;
  }
  if (png_ptr->gamma_16_to_1 != (png_uint_16pp)0x0) {
    iVar1 = png_ptr->gamma_shift;
    for (local_24 = 0; local_24 < 1 << (8U - (char)iVar1 & 0x1f); local_24 = local_24 + 1) {
      png_free(png_ptr,png_ptr->gamma_16_to_1[local_24]);
    }
    png_free(png_ptr,png_ptr->gamma_16_to_1);
    png_ptr->gamma_16_to_1 = (png_uint_16pp)0x0;
  }
  return;
}

Assistant:

void /* PRIVATE */
png_destroy_gamma_table(png_structrp png_ptr)
{
   png_free(png_ptr, png_ptr->gamma_table);
   png_ptr->gamma_table = NULL;

#ifdef PNG_16BIT_SUPPORTED
   if (png_ptr->gamma_16_table != NULL)
   {
      int i;
      int istop = (1 << (8 - png_ptr->gamma_shift));
      for (i = 0; i < istop; i++)
      {
         png_free(png_ptr, png_ptr->gamma_16_table[i]);
      }
   png_free(png_ptr, png_ptr->gamma_16_table);
   png_ptr->gamma_16_table = NULL;
   }
#endif /* 16BIT */

#if defined(PNG_READ_BACKGROUND_SUPPORTED) || \
   defined(PNG_READ_ALPHA_MODE_SUPPORTED) || \
   defined(PNG_READ_RGB_TO_GRAY_SUPPORTED)
   png_free(png_ptr, png_ptr->gamma_from_1);
   png_ptr->gamma_from_1 = NULL;
   png_free(png_ptr, png_ptr->gamma_to_1);
   png_ptr->gamma_to_1 = NULL;

#ifdef PNG_16BIT_SUPPORTED
   if (png_ptr->gamma_16_from_1 != NULL)
   {
      int i;
      int istop = (1 << (8 - png_ptr->gamma_shift));
      for (i = 0; i < istop; i++)
      {
         png_free(png_ptr, png_ptr->gamma_16_from_1[i]);
      }
   png_free(png_ptr, png_ptr->gamma_16_from_1);
   png_ptr->gamma_16_from_1 = NULL;
   }
   if (png_ptr->gamma_16_to_1 != NULL)
   {
      int i;
      int istop = (1 << (8 - png_ptr->gamma_shift));
      for (i = 0; i < istop; i++)
      {
         png_free(png_ptr, png_ptr->gamma_16_to_1[i]);
      }
   png_free(png_ptr, png_ptr->gamma_16_to_1);
   png_ptr->gamma_16_to_1 = NULL;
   }
#endif /* 16BIT */
#endif /* READ_BACKGROUND || READ_ALPHA_MODE || RGB_TO_GRAY */
}